

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int js_proxy_preventExtensions(JSContext *ctx,JSValue obj)

{
  int iVar1;
  int iVar2;
  JSProxyData *argv;
  JSValue JVar3;
  JSValue method;
  JSValueUnion local_28;
  int64_t local_20;
  
  argv = get_proxy_method(ctx,(JSValue *)&local_28,obj,0x62);
  if (argv != (JSProxyData *)0x0) {
    if ((int)local_20 == 3) {
      iVar1 = JS_PreventExtensions(ctx,argv->target);
      return iVar1;
    }
    JVar3.tag = local_20;
    JVar3.u.float64 = local_28.float64;
    JVar3 = JS_CallFree(ctx,JVar3,argv->handler,1,&argv->target);
    if ((int)JVar3.tag != 6) {
      iVar1 = JS_ToBoolFree(ctx,JVar3);
      if (iVar1 == 0) {
        return 0;
      }
      iVar2 = JS_IsExtensible(ctx,argv->target);
      if (-1 < iVar2) {
        if (iVar2 == 0) {
          return iVar1;
        }
        JS_ThrowTypeError(ctx,"proxy: inconsistent preventExtensions");
      }
    }
  }
  return -1;
}

Assistant:

static int js_proxy_preventExtensions(JSContext *ctx, JSValueConst obj)
{
    JSProxyData *s;
    JSValue method, ret;
    BOOL res;
    int res2;

    s = get_proxy_method(ctx, &method, obj, JS_ATOM_preventExtensions);
    if (!s)
        return -1;
    if (JS_IsUndefined(method))
        return JS_PreventExtensions(ctx, s->target);
    ret = JS_CallFree(ctx, method, s->handler, 1, (JSValueConst *)&s->target);
    if (JS_IsException(ret))
        return -1;
    res = JS_ToBoolFree(ctx, ret);
    if (res) {
        res2 = JS_IsExtensible(ctx, s->target);
        if (res2 < 0)
            return res2;
        if (res2) {
            JS_ThrowTypeError(ctx, "proxy: inconsistent preventExtensions");
            return -1;
        }
    }
    return res;
}